

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O2

TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> * __thiscall
ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>::InitInfo
          (TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> *this)

{
  InterchangeObject **ppIVar1;
  undefined8 uVar2;
  long in_RSI;
  InterchangeObject *Object;
  Result_t cr_result;
  CryptographicContext local_f0 [104];
  Identification local_88 [104];
  
  if (*(long *)(in_RSI + 8) != 0) {
    ppIVar1 = (InterchangeObject **)(in_RSI + 0x18);
    ASDCP::Dictionary::Type((MDD_t)*(long *)(in_RSI + 8));
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)this,ppIVar1);
    if (-1 < *(int *)&this->_vptr_TrackFileReader) {
      ASDCP::MD_to_WriterInfo(local_88,(WriterInfo *)Object);
      Kumu::Result_t::~Result_t((Result_t *)local_88);
      ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(in_RSI + 8));
      ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)&cr_result,ppIVar1);
      Kumu::Result_t::operator=((Result_t *)this,&cr_result);
      Kumu::Result_t::~Result_t(&cr_result);
      if (-1 < *(int *)&this->_vptr_TrackFileReader) {
        uVar2 = *(undefined8 *)(Object + 0xc1);
        *(undefined8 *)(in_RSI + 0x430) = *(undefined8 *)(Object + 0xb9);
        *(undefined8 *)(in_RSI + 0x438) = uVar2;
        ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(in_RSI + 8));
        ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)&cr_result,ppIVar1);
        if (-1 < _cr_result) {
          ASDCP::MD_to_CryptoInfo(local_f0,(WriterInfo *)Object,(Dictionary *)(in_RSI + 0x420));
          Kumu::Result_t::~Result_t((Result_t *)local_f0);
        }
        Kumu::Result_t::~Result_t(&cr_result);
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x11b,
                "Result_t ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader, AS_02::MXF::AS02IndexReader>::InitInfo() [HeaderType = ASDCP::MXF::OP1aHeader, IndexAccessType = AS_02::MXF::AS02IndexReader]"
               );
}

Assistant:

Result_t InitInfo()
	{
	  assert(m_Dict);
	  InterchangeObject* Object;

	  // Identification
	  Result_t result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(Identification), &Object);

	  // Writer Info and SourcePackage
	  if ( KM_SUCCESS(result) )
	    {
	      MD_to_WriterInfo((Identification*)Object, m_Info);
	      result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(SourcePackage), &Object);
	    }

	  if ( KM_SUCCESS(result) )
	    {
	      SourcePackage* SP = (SourcePackage*)Object;
	      memcpy(m_Info.AssetUUID, SP->PackageUID.Value() + 16, UUIDlen);
	    }

	  // optional CryptographicContext
	  if ( KM_SUCCESS(result) )
	    {
	      Result_t cr_result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(CryptographicContext), &Object);

	      if ( KM_SUCCESS(cr_result) )
		MD_to_CryptoInfo((CryptographicContext*)Object, m_Info, *m_Dict);
	    }

	  return result;
	}